

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::CodeGeneratorRequest::SerializeWithCachedSizes
          (CodeGeneratorRequest *this,CodedOutputStream *output)

{
  uint uVar1;
  char *data;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar2;
  LogMessage *pLVar3;
  ulong uVar4;
  undefined8 *puVar5;
  long lVar6;
  LogFinisher local_69;
  LogMessage local_68;
  
  uVar1 = (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_;
  uVar4 = (ulong)uVar1;
  if (0 < (int)uVar1) {
    lVar6 = 0;
    do {
      puVar5 = (undefined8 *)(this->file_to_generate_).super_RepeatedPtrFieldBase.elements_[lVar6];
      data = (char *)*puVar5;
      if ((int)uVar4 <= lVar6) {
        internal::LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                   ,0x338);
        pLVar3 = internal::LogMessage::operator<<(&local_68,"CHECK failed: (index) < (size()): ");
        internal::LogFinisher::operator=(&local_69,pLVar3);
        internal::LogMessage::~LogMessage(&local_68);
        puVar5 = (undefined8 *)(this->file_to_generate_).super_RepeatedPtrFieldBase.elements_[lVar6]
        ;
      }
      internal::WireFormat::VerifyUTF8StringFallback(data,*(int *)(puVar5 + 1),SERIALIZE);
      if ((this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_ <= lVar6) {
        internal::LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                   ,0x338);
        pLVar3 = internal::LogMessage::operator<<(&local_68,"CHECK failed: (index) < (size()): ");
        internal::LogFinisher::operator=(&local_69,pLVar3);
        internal::LogMessage::~LogMessage(&local_68);
      }
      internal::WireFormatLite::WriteString
                (1,(string *)(this->file_to_generate_).super_RepeatedPtrFieldBase.elements_[lVar6],
                 output);
      lVar6 = lVar6 + 1;
      uVar4 = (ulong)(this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_;
    } while (lVar6 < (long)uVar4);
  }
  if ((this->_has_bits_[0] & 2) != 0) {
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->parameter_->_M_dataplus)._M_p,(int)this->parameter_->_M_string_length,
               SERIALIZE);
    internal::WireFormatLite::WriteString(2,this->parameter_,output);
  }
  if (0 < (this->proto_file_).super_RepeatedPtrFieldBase.current_size_) {
    lVar6 = 0;
    do {
      internal::WireFormatLite::WriteMessageMaybeToArray
                (0xf,(MessageLite *)(this->proto_file_).super_RepeatedPtrFieldBase.elements_[lVar6],
                 output);
      lVar6 = lVar6 + 1;
    } while (lVar6 < (this->proto_file_).super_RepeatedPtrFieldBase.current_size_);
  }
  pvVar2 = (this->_unknown_fields_).fields_;
  if ((pvVar2 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar2->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar2->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    internal::WireFormat::SerializeUnknownFields(&this->_unknown_fields_,output);
  }
  return;
}

Assistant:

void CodeGeneratorRequest::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // repeated string file_to_generate = 1;
  for (int i = 0; i < this->file_to_generate_size(); i++) {
  ::google::protobuf::internal::WireFormat::VerifyUTF8String(
    this->file_to_generate(i).data(), this->file_to_generate(i).length(),
    ::google::protobuf::internal::WireFormat::SERIALIZE);
    ::google::protobuf::internal::WireFormatLite::WriteString(
      1, this->file_to_generate(i), output);
  }

  // optional string parameter = 2;
  if (has_parameter()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->parameter().data(), this->parameter().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    ::google::protobuf::internal::WireFormatLite::WriteString(
      2, this->parameter(), output);
  }

  // repeated .google.protobuf.FileDescriptorProto proto_file = 15;
  for (int i = 0; i < this->proto_file_size(); i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      15, this->proto_file(i), output);
  }

  if (!unknown_fields().empty()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
}